

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O3

void chapter3::user_query
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *word_count)

{
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  string search_word;
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please enter a word to search (q to quit): ",0x2b);
  std::operator>>((istream *)&std::cin,(string *)&local_50);
  while( true ) {
    iVar1 = std::__cxx11::string::compare((char *)&local_50);
    if ((iVar1 == 0) || (local_50._M_string_length == 0)) break;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&word_count->_M_t,&local_50);
    if ((_Rb_tree_header *)cVar2._M_node == &(word_count->_M_t)._M_impl.super__Rb_tree_header) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not found!",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      poVar3 = (ostream *)&std::cout;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(cVar2._M_node + 1),
                          (long)cVar2._M_node[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,cVar2._M_node[2]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," times",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Another search (q to quit): ",0x1c);
    std::operator>>((istream *)&std::cin,(string *)&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void chapter3::user_query(const map<string, int> &word_count) {
    string search_word;
    cout << "Please enter a word to search (q to quit): ";
    cin >> search_word;

    while (search_word != "q" && search_word.size()) {
        map<string, int>::const_iterator itr;
        if ((itr = word_count.find(search_word)) != word_count.end()) {
            cout << "Found "
                 << itr->first
                 << " "
                 << itr-> second
                 << " times" << endl;
        } else {
            cout << "Not found!" << endl;
        }

        cout << "Another search (q to quit): ";
        cin >> search_word;
    }
}